

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O0

void __thiscall duckdb::MergeJoinLocalState::~MergeJoinLocalState(MergeJoinLocalState *this)

{
  MergeJoinLocalState *in_RDI;
  
  ~MergeJoinLocalState(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

explicit MergeJoinLocalState(ClientContext &context, const PhysicalRangeJoin &op, const idx_t child)
	    : table(context, op, child) {
	}